

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O3

void __thiscall ON_SubDMeshFragment::Clear(ON_SubDMeshFragment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ON_Color OVar6;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  unsigned_short uVar10;
  unsigned_short uVar11;
  undefined8 uVar12;
  ON__UINT16 OVar13;
  ON__UINT32 OVar14;
  uint *puVar15;
  uint *puVar16;
  ON_SubDMeshFragmentGrid *pOVar17;
  ON_SubDMeshFragmentGrid *pOVar18;
  undefined8 uVar19;
  
  this->m_face_fragment_count = 0;
  this->m_face_fragment_index = 0;
  this->m_face = (ON_SubDFace *)0x0;
  this->m_face_vertex_index[0] = 0;
  this->m_face_vertex_index[1] = 0;
  this->m_face_vertex_index[2] = 0;
  this->m_face_vertex_index[3] = 0;
  this->m_vertex_count_etc = this->m_vertex_count_etc & 0xe000;
  ClearTextureCoordinates(this);
  dVar1 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[0].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[0].k2 = dVar1;
  dVar1 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[1].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[1].k2 = dVar1;
  dVar1 = ON_SurfaceCurvature::Nan.k2;
  this->m_ctrlnetK[2].k1 = ON_SurfaceCurvature::Nan.k1;
  this->m_ctrlnetK[2].k2 = dVar1;
  dVar2 = ON_SurfaceCurvature::Nan.k2;
  dVar1 = ON_SurfaceCurvature::Nan.k1;
  this->m_vertex_capacity_etc = this->m_vertex_capacity_etc & 0x9fff;
  this->m_ctrlnetK[3].k1 = dVar1;
  this->m_ctrlnetK[3].k2 = dVar2;
  OVar6 = ON_Color::UnsetColor;
  this->m_ctrlnetC[0].field_0 = ON_Color::UnsetColor.field_0;
  this->m_ctrlnetC[1].field_0 = OVar6.field_0;
  this->m_ctrlnetC[2].field_0 = OVar6.field_0;
  this->m_ctrlnetC[3].field_0 = OVar6.field_0;
  ClearControlNetQuad(this);
  dVar1 = ON_DBL_QNAN;
  this->m_pack_rect[0][0] = ON_DBL_QNAN;
  this->m_pack_rect[0][1] = dVar1;
  this->m_pack_rect[1][0] = dVar1;
  this->m_pack_rect[1][1] = dVar1;
  this->m_pack_rect[2][0] = dVar1;
  this->m_pack_rect[2][1] = dVar1;
  this->m_pack_rect[3][0] = dVar1;
  this->m_pack_rect[3][1] = dVar1;
  pOVar18 = ON_SubDMeshFragmentGrid::Empty.m_next_level_of_detail;
  pOVar17 = ON_SubDMeshFragmentGrid::Empty.m_prev_level_of_detail;
  puVar16 = ON_SubDMeshFragmentGrid::Empty.m_S;
  puVar15 = ON_SubDMeshFragmentGrid::Empty.m_F;
  uVar12 = ON_SubDMeshFragmentGrid::Empty._8_8_;
  uVar7 = ON_SubDMeshFragmentGrid::Empty.m_reserved2;
  uVar8 = ON_SubDMeshFragmentGrid::Empty.m_side_segment_count;
  uVar9 = ON_SubDMeshFragmentGrid::Empty.m_reserved3;
  uVar10 = ON_SubDMeshFragmentGrid::Empty.m_F_count;
  uVar11 = ON_SubDMeshFragmentGrid::Empty.m_F_level_of_detail;
  (this->m_grid).m_reserved1 = ON_SubDMeshFragmentGrid::Empty.m_reserved1;
  uVar19 = ON_SubDMeshFragmentGrid::Empty._8_8_;
  (this->m_grid).m_reserved2 = uVar7;
  (this->m_grid).m_side_segment_count = uVar8;
  (this->m_grid).m_reserved3 = uVar9;
  (this->m_grid).m_F_count = uVar10;
  (this->m_grid).m_F_level_of_detail = uVar11;
  ON_SubDMeshFragmentGrid::Empty.m_F_stride = (unsigned_short)uVar12;
  ON_SubDMeshFragmentGrid::Empty.m_reserved4 = SUB82(uVar12,2);
  OVar13 = ON_SubDMeshFragmentGrid::Empty.m_reserved4;
  ON_SubDMeshFragmentGrid::Empty.m_reserved5 = SUB84(uVar12,4);
  OVar14 = ON_SubDMeshFragmentGrid::Empty.m_reserved5;
  (this->m_grid).m_F_stride = ON_SubDMeshFragmentGrid::Empty.m_F_stride;
  ON_SubDMeshFragmentGrid::Empty._8_8_ = uVar19;
  (this->m_grid).m_reserved4 = OVar13;
  (this->m_grid).m_reserved5 = OVar14;
  (this->m_grid).m_F = puVar15;
  (this->m_grid).m_S = puVar16;
  (this->m_grid).m_prev_level_of_detail = pOVar17;
  (this->m_grid).m_next_level_of_detail = pOVar18;
  dVar5 = ON_BoundingBox::NanBoundingBox.m_max.z;
  dVar4 = ON_BoundingBox::NanBoundingBox.m_max.y;
  dVar3 = ON_BoundingBox::NanBoundingBox.m_max.x;
  dVar2 = ON_BoundingBox::NanBoundingBox.m_min.z;
  dVar1 = ON_BoundingBox::NanBoundingBox.m_min.y;
  (this->m_surface_bbox).m_min.x = ON_BoundingBox::NanBoundingBox.m_min.x;
  (this->m_surface_bbox).m_min.y = dVar1;
  (this->m_surface_bbox).m_min.z = dVar2;
  (this->m_surface_bbox).m_max.x = dVar3;
  (this->m_surface_bbox).m_max.y = dVar4;
  (this->m_surface_bbox).m_max.z = dVar5;
  return;
}

Assistant:

void ON_SubDMeshFragment::Clear() ON_NOEXCEPT
{
  m_face = nullptr;
  m_face_vertex_index[0] = 0;
  m_face_vertex_index[1] = 0;
  m_face_vertex_index[2] = 0;
  m_face_vertex_index[3] = 0;

  m_face_fragment_count = 0;
  m_face_fragment_index = 0;

  // This line sets vertex count = 0
  m_vertex_count_etc &= ON_SubDMeshFragment::EtcMask;

  // Do NOT change vertex capacity.
  // Do NOT delete managed arrays.
  // The point is to be able to clear and reuse a fragment.

  ClearTextureCoordinates();
  ClearCurvatures();
  ClearColors();
  ClearControlNetQuad();
  ClearPackRect();
  m_grid = ON_SubDMeshFragmentGrid::Empty;
  m_surface_bbox = ON_BoundingBox::NanBoundingBox;
}